

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdUndo.cpp
# Opt level: O0

void undoIntervalAction(UndoAction *action,Database *database)

{
  string local_1e8;
  undefined1 local_1c8 [8];
  Interval after;
  string local_f8;
  undefined1 local_d8 [8];
  Interval before;
  Database *database_local;
  UndoAction *action_local;
  
  before._tags._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)database;
  UndoAction::getBefore_abi_cxx11_(&local_f8,action);
  IntervalFactory::fromJson((Interval *)local_d8,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  UndoAction::getAfter_abi_cxx11_(&local_1e8,action);
  IntervalFactory::fromJson((Interval *)local_1c8,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  Database::modifyInterval
            ((Database *)before._tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Interval *)local_1c8,(Interval *)local_d8,false);
  Interval::~Interval((Interval *)local_1c8);
  Interval::~Interval((Interval *)local_d8);
  return;
}

Assistant:

static void undoIntervalAction(UndoAction& action, Database& database)
{
  Interval before = IntervalFactory::fromJson (action.getBefore ());
  Interval after = IntervalFactory::fromJson (action.getAfter ());

  database.modifyInterval (after, before, false);
}